

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O1

void ft_gzip_stream_close(FT_Stream stream)

{
  undefined8 *P;
  FT_Memory memory;
  
  P = (undefined8 *)(stream->descriptor).pointer;
  memory = stream->memory;
  if (P != (undefined8 *)0x0) {
    inflateEnd((z_streamp)(P + 3));
    P[6] = 0;
    *(undefined4 *)(P + 7) = 0;
    *P = 0;
    P[1] = 0;
    P[2] = 0;
    P[3] = 0;
    *(undefined4 *)(P + 4) = 0;
    P[0xb] = 0;
    P[0xc] = 0;
    P[0xd] = 0;
    ft_mem_free(memory,P);
    (stream->descriptor).value = 0;
  }
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    ft_mem_free(memory,stream->base);
    stream->base = (uchar *)0x0;
  }
  return;
}

Assistant:

static void
  ft_gzip_stream_close( FT_Stream  stream )
  {
    FT_GZipFile  zip    = (FT_GZipFile)stream->descriptor.pointer;
    FT_Memory    memory = stream->memory;


    if ( zip )
    {
      /* finalize gzip file descriptor */
      ft_gzip_file_done( zip );

      FT_FREE( zip );

      stream->descriptor.pointer = NULL;
    }

    if ( !stream->read )
      FT_FREE( stream->base );
  }